

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpainter.h
# Opt level: O2

void __thiscall
QPainter::drawImage(QPainter *this,int x,int y,QImage *image,int sx,int sy,int sw,int sh,
                   ImageConversionFlags flags)

{
  long in_FS_OFFSET;
  QRectF local_58;
  QRectF local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_38.xp = (qreal)x;
  local_38.yp = (qreal)y;
  if (((sh & sw) == 0xffffffff && (sy == 0 && sx == 0)) &&
      (QFlagsStorage<Qt::ImageConversionFlag>)
      flags.super_QFlagsStorageHelper<Qt::ImageConversionFlag,_4>.
      super_QFlagsStorage<Qt::ImageConversionFlag>.i == (QFlagsStorage<Qt::ImageConversionFlag>)0x0)
  {
    drawImage(this,(QPointF *)&local_38,image);
  }
  else {
    local_58.xp = (qreal)sx;
    local_58.yp = (qreal)sy;
    local_58.w = (qreal)sw;
    local_38.w = -1.0;
    local_38.h = -1.0;
    local_58.h = (qreal)sh;
    drawImage(this,&local_38,image,&local_58,flags);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

inline void QPainter::drawImage(int x, int y, const QImage &image, int sx, int sy, int sw, int sh,
                                Qt::ImageConversionFlags flags)
{
    if (sx == 0 && sy == 0 && sw == -1 && sh == -1 && flags == Qt::AutoColor)
        drawImage(QPointF(x, y), image);
    else
        drawImage(QRectF(x, y, -1, -1), image, QRectF(sx, sy, sw, sh), flags);
}